

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::protobuf_google_2fprotobuf_2fdescriptor_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0074a770 == '\x01') {
    DAT_0074a770 = '\0';
    (*(code *)*_FileDescriptorSet_default_instance_)();
  }
  if (DAT_0074b108 != (long *)0x0) {
    (**(code **)(*DAT_0074b108 + 8))();
  }
  if (DAT_0074a850 == '\x01') {
    DAT_0074a850 = '\0';
    (*(code *)*_FileDescriptorProto_default_instance_)();
  }
  if (_DAT_0074b118 != (long *)0x0) {
    (**(code **)(*_DAT_0074b118 + 8))();
  }
  if (DAT_0074a878 == '\x01') {
    DAT_0074a878 = '\0';
    (*(code *)*_DescriptorProto_ExtensionRange_default_instance_)();
  }
  if (_DAT_0074b128 != (long *)0x0) {
    (**(code **)(*_DAT_0074b128 + 8))();
  }
  if (DAT_0074a8a0 == '\x01') {
    DAT_0074a8a0 = '\0';
    (*(code *)*_DescriptorProto_ReservedRange_default_instance_)();
  }
  if (_DAT_0074b138 != (long *)0x0) {
    (**(code **)(*_DAT_0074b138 + 8))();
  }
  if (DAT_0074a990 == '\x01') {
    DAT_0074a990 = '\0';
    (*(code *)*_DescriptorProto_default_instance_)();
  }
  if (DAT_0074b148 != (long *)0x0) {
    (**(code **)(*DAT_0074b148 + 8))();
  }
  if (DAT_0074a9f0 == '\x01') {
    DAT_0074a9f0 = '\0';
    (*(code *)*_FieldDescriptorProto_default_instance_)();
  }
  if (DAT_0074b158 != (long *)0x0) {
    (**(code **)(*DAT_0074b158 + 8))();
  }
  if (DAT_0074aa20 == '\x01') {
    DAT_0074aa20 = '\0';
    (*(code *)*_OneofDescriptorProto_default_instance_)();
  }
  if (_DAT_0074b168 != (long *)0x0) {
    (**(code **)(*_DAT_0074b168 + 8))();
  }
  if (DAT_0074aa68 == '\x01') {
    DAT_0074aa68 = '\0';
    (*(code *)*_EnumDescriptorProto_default_instance_)();
  }
  if (_DAT_0074b178 != (long *)0x0) {
    (**(code **)(*_DAT_0074b178 + 8))();
  }
  if (DAT_0074aaa0 == '\x01') {
    DAT_0074aaa0 = '\0';
    (*(code *)*_EnumValueDescriptorProto_default_instance_)();
  }
  if (_DAT_0074b188 != (long *)0x0) {
    (**(code **)(*_DAT_0074b188 + 8))();
  }
  if (DAT_0074aae8 == '\x01') {
    DAT_0074aae8 = '\0';
    (*(code *)*_ServiceDescriptorProto_default_instance_)();
  }
  if (_DAT_0074b198 != (long *)0x0) {
    (**(code **)(*_DAT_0074b198 + 8))();
  }
  if (DAT_0074ab30 == '\x01') {
    DAT_0074ab30 = '\0';
    (*(code *)*_MethodDescriptorProto_default_instance_)();
  }
  if (_DAT_0074b1a8 != (long *)0x0) {
    (**(code **)(*_DAT_0074b1a8 + 8))();
  }
  if (DAT_0074abe8 == '\x01') {
    DAT_0074abe8 = '\0';
    (*(code *)*_FileOptions_default_instance_)();
  }
  if (_DAT_0074b1b8 != (long *)0x0) {
    (**(code **)(*_DAT_0074b1b8 + 8))();
  }
  if (DAT_0074ac60 == '\x01') {
    DAT_0074ac60 = '\0';
    (*(code *)*_MessageOptions_default_instance_)();
  }
  if (_DAT_0074b1c8 != (long *)0x0) {
    (**(code **)(*_DAT_0074b1c8 + 8))();
  }
  if (DAT_0074ace0 == '\x01') {
    DAT_0074ace0 = '\0';
    (*(code *)*_FieldOptions_default_instance_)();
  }
  if (_DAT_0074b1d8 != (long *)0x0) {
    (**(code **)(*_DAT_0074b1d8 + 8))();
  }
  if (DAT_0074ad50 == '\x01') {
    DAT_0074ad50 = '\0';
    (*(code *)*_OneofOptions_default_instance_)();
  }
  if (_DAT_0074b1e8 != (long *)0x0) {
    (**(code **)(*_DAT_0074b1e8 + 8))();
  }
  if (DAT_0074adc8 == '\x01') {
    DAT_0074adc8 = '\0';
    (*(code *)*_EnumOptions_default_instance_)();
  }
  if (_DAT_0074b1f8 != (long *)0x0) {
    (**(code **)(*_DAT_0074b1f8 + 8))();
  }
  if (DAT_0074ae40 == '\x01') {
    DAT_0074ae40 = '\0';
    (*(code *)*_EnumValueOptions_default_instance_)();
  }
  if (_DAT_0074b208 != (long *)0x0) {
    (**(code **)(*_DAT_0074b208 + 8))();
  }
  if (DAT_0074aeb8 == '\x01') {
    DAT_0074aeb8 = '\0';
    (*(code *)*_ServiceOptions_default_instance_)();
  }
  if (_DAT_0074b218 != (long *)0x0) {
    (**(code **)(*_DAT_0074b218 + 8))();
  }
  if (DAT_0074af30 == '\x01') {
    DAT_0074af30 = '\0';
    (*(code *)*_MethodOptions_default_instance_)();
  }
  if (_DAT_0074b228 != (long *)0x0) {
    (**(code **)(*_DAT_0074b228 + 8))();
  }
  if (DAT_0074af60 == '\x01') {
    DAT_0074af60 = '\0';
    (*(code *)*_UninterpretedOption_NamePart_default_instance_)();
  }
  if (DAT_0074b238 != (long *)0x0) {
    (**(code **)(*DAT_0074b238 + 8))();
  }
  if (DAT_0074afc8 == '\x01') {
    DAT_0074afc8 = '\0';
    (*(code *)*_UninterpretedOption_default_instance_)();
  }
  if (_DAT_0074b248 != (long *)0x0) {
    (**(code **)(*_DAT_0074b248 + 8))();
  }
  if (DAT_0074b040 == '\x01') {
    DAT_0074b040 = '\0';
    (*(code *)*_SourceCodeInfo_Location_default_instance_)();
  }
  if (_DAT_0074b258 != (long *)0x0) {
    (**(code **)(*_DAT_0074b258 + 8))();
  }
  if (DAT_0074b078 == '\x01') {
    DAT_0074b078 = '\0';
    (*(code *)*_SourceCodeInfo_default_instance_)();
  }
  if (_DAT_0074b268 != (long *)0x0) {
    (**(code **)(*_DAT_0074b268 + 8))();
  }
  if (DAT_0074b0c0 == '\x01') {
    DAT_0074b0c0 = '\0';
    (*(code *)*_GeneratedCodeInfo_Annotation_default_instance_)();
  }
  if (_DAT_0074b278 != (long *)0x0) {
    (**(code **)(*_DAT_0074b278 + 8))();
  }
  if (DAT_0074b0f8 == '\x01') {
    DAT_0074b0f8 = '\0';
    (*(code *)*_GeneratedCodeInfo_default_instance_)();
  }
  if (_DAT_0074b288 != (long *)0x0) {
    (**(code **)(*_DAT_0074b288 + 8))();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _FileDescriptorSet_default_instance_.Shutdown();
  delete file_level_metadata[0].reflection;
  _FileDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[1].reflection;
  _DescriptorProto_ExtensionRange_default_instance_.Shutdown();
  delete file_level_metadata[2].reflection;
  _DescriptorProto_ReservedRange_default_instance_.Shutdown();
  delete file_level_metadata[3].reflection;
  _DescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[4].reflection;
  _FieldDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[5].reflection;
  _OneofDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[6].reflection;
  _EnumDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[7].reflection;
  _EnumValueDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[8].reflection;
  _ServiceDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[9].reflection;
  _MethodDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[10].reflection;
  _FileOptions_default_instance_.Shutdown();
  delete file_level_metadata[11].reflection;
  _MessageOptions_default_instance_.Shutdown();
  delete file_level_metadata[12].reflection;
  _FieldOptions_default_instance_.Shutdown();
  delete file_level_metadata[13].reflection;
  _OneofOptions_default_instance_.Shutdown();
  delete file_level_metadata[14].reflection;
  _EnumOptions_default_instance_.Shutdown();
  delete file_level_metadata[15].reflection;
  _EnumValueOptions_default_instance_.Shutdown();
  delete file_level_metadata[16].reflection;
  _ServiceOptions_default_instance_.Shutdown();
  delete file_level_metadata[17].reflection;
  _MethodOptions_default_instance_.Shutdown();
  delete file_level_metadata[18].reflection;
  _UninterpretedOption_NamePart_default_instance_.Shutdown();
  delete file_level_metadata[19].reflection;
  _UninterpretedOption_default_instance_.Shutdown();
  delete file_level_metadata[20].reflection;
  _SourceCodeInfo_Location_default_instance_.Shutdown();
  delete file_level_metadata[21].reflection;
  _SourceCodeInfo_default_instance_.Shutdown();
  delete file_level_metadata[22].reflection;
  _GeneratedCodeInfo_Annotation_default_instance_.Shutdown();
  delete file_level_metadata[23].reflection;
  _GeneratedCodeInfo_default_instance_.Shutdown();
  delete file_level_metadata[24].reflection;
}